

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  size_t sVar6;
  Mat *this_00;
  pointer pMVar7;
  bool bVar8;
  pointer pRVar9;
  pointer pRVar10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar11;
  int iVar12;
  undefined8 *puVar13;
  long lVar14;
  float *pfVar15;
  ulong uVar16;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  void *pvVar20;
  Rect *pRVar21;
  pointer pfVar22;
  long lVar23;
  void *pvVar24;
  int iVar25;
  void *pvVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  vector<float,_std::allocator<float>_> scores;
  void *ptr;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  unsigned_long *local_258;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_248;
  vector<float,_std::allocator<float>_> local_228;
  pointer local_208;
  pointer local_200;
  ulong local_1f8;
  ulong local_1f0;
  pointer local_1e8;
  long local_1e0;
  ulong local_1d8;
  unsigned_long local_1d0;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  void *local_1a8;
  void *local_1a0;
  void *local_198;
  void *local_190;
  long local_188;
  void *local_180;
  ulong local_178;
  ulong local_170;
  vector<float,_std::allocator<float>_> local_168;
  undefined4 local_150;
  undefined8 local_148;
  undefined8 local_140;
  int local_138;
  undefined4 local_134;
  ulong local_130;
  pointer local_128;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_120;
  long local_118;
  long local_110;
  ulong local_108;
  long local_100;
  long local_f8;
  long local_f0;
  ulong local_e8;
  pointer local_e0;
  pointer local_d8;
  pointer pfStack_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  long *local_b8;
  undefined8 local_b0;
  uint local_a8;
  int local_a4;
  ulong local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_208 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_178 = (ulong)local_208->w;
  local_170 = (ulong)(uint)local_208->h;
  iVar25 = (this->anchors).h;
  lVar23 = (long)iVar25;
  local_a8 = local_208->h * local_208->w;
  local_1f0 = (ulong)local_a8;
  local_d8 = (pointer)0x0;
  pfStack_d0 = (pointer)0x0;
  local_c8 = 4;
  local_c0 = 1;
  local_b8 = (long *)0x0;
  local_b0 = 0x400000003;
  local_108 = (ulong)(int)(local_a8 * 4);
  local_1f8 = local_108 & 0x3ffffffffffffffc;
  lVar17 = local_1f8 * lVar23;
  local_120 = top_blobs;
  local_a4 = iVar25;
  local_a0 = local_1f8;
  if (lVar17 == 0) {
    local_200 = (pointer)0x0;
  }
  else {
    local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    iVar12 = posix_memalign((void **)&local_168,0x10,lVar17 * 4 + 4);
    local_200 = local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_d8 = (pointer)0x0;
    if (iVar12 == 0) {
      local_d8 = local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
    pfStack_d0 = local_d8 + lVar17;
    *pfStack_d0 = 1.4013e-45;
  }
  local_1d8 = local_1f0 & 0xffffffff;
  local_188 = lVar23;
  local_128 = pfStack_d0;
  if (iVar25 < 1) {
    puVar13 = (undefined8 *)local_208[2].data;
  }
  else {
    uVar19 = local_178 & 0xffffffff;
    local_190 = local_208[1].data;
    lVar17 = local_208[1].cstep * local_208[1].elemsize;
    local_1f8 = local_1f8 << 2;
    local_180 = (this->anchors).data;
    local_1c4 = (float)this->feat_stride;
    local_118 = (long)(this->anchors).w * (this->anchors).elemsize;
    local_f0 = local_178 << 4;
    local_1a0 = (void *)(lVar17 * 3 + (long)local_190);
    local_110 = lVar17 * 4;
    local_f8 = local_178 * 4;
    local_1a8 = (void *)((long)local_190 + lVar17 * 2);
    local_198 = (void *)(lVar17 + (long)local_190);
    local_1e0 = 0;
    local_1e8 = local_200;
    do {
      if (0 < (int)local_170) {
        local_100 = local_1e0 * local_118;
        fVar27 = (float)((ulong)*(undefined8 *)((long)local_180 + local_100) >> 0x20);
        uVar3 = *(undefined8 *)((long)local_180 + local_100 + 8);
        fVar31 = (float)uVar3 - (float)*(undefined8 *)((long)local_180 + local_100);
        fVar33 = (float)((ulong)uVar3 >> 0x20) - fVar27;
        fStack_80 = fVar31 * 0.5;
        fStack_7c = fVar33 * 0.5;
        local_1c0 = (float)this->feat_stride;
        uVar16 = 0;
        local_78 = CONCAT44(fVar33,fVar31);
        uStack_70 = 0;
        pvVar18 = local_1a0;
        pvVar20 = local_1a8;
        pfVar22 = local_1e8;
        pvVar24 = local_198;
        pvVar26 = local_190;
        fVar28 = fVar27;
        fVar32 = fVar27;
        fVar30 = fVar27;
        local_98 = fVar33;
        fStack_94 = fVar33;
        fStack_90 = fVar33;
        fStack_8c = fVar33;
        do {
          local_e8 = uVar16;
          if (0 < (int)local_178) {
            fVar34 = *(float *)((long)local_180 + local_100);
            uStack_1b4 = 0;
            uStack_1b0 = 0;
            uStack_1ac = 0;
            lVar17 = 0;
            local_e0 = pfVar22;
            local_68 = fVar27;
            fStack_64 = fVar28;
            fStack_60 = fVar32;
            fStack_5c = fVar30;
            do {
              local_1bc = *(float *)((long)pvVar18 + lVar17);
              local_48._4_4_ = 0;
              local_48._0_4_ = (*(float *)((long)pvVar24 + lVar17) + 0.5) * fVar33;
              local_48._8_4_ = (*(float *)((long)pvVar26 + lVar17) + 0.5) * fVar31;
              local_48._12_4_ = 0;
              local_1b8 = fVar34;
              local_58 = expf(*(float *)((long)pvVar20 + lVar17));
              fVar27 = expf(local_1bc);
              pfVar15 = local_e0 + lVar17;
              *pfVar15 = ((float)local_48._8_4_ + local_1b8) - local_58 * fStack_80;
              pfVar15[1] = ((float)local_48._0_4_ + local_68) - fVar27 * fStack_7c;
              pfVar15[2] = (float)local_48._8_4_ + local_1b8 + local_58 * fStack_80;
              pfVar15[3] = (float)local_48._0_4_ + local_68 + fVar27 * fStack_7c;
              fVar34 = local_1b8 + local_1c0;
              lVar17 = lVar17 + 4;
              pfVar22 = local_e0;
              fVar27 = local_68;
              fVar28 = fStack_64;
              fVar32 = fStack_60;
              fVar30 = fStack_5c;
              fVar31 = (float)local_78;
              fVar33 = local_98;
            } while (uVar19 << 2 != lVar17);
          }
          fVar27 = fVar27 + local_1c4;
          uVar16 = local_e8 + 1;
          pfVar22 = (pointer)((long)pfVar22 + local_f0);
          pvVar18 = (void *)((long)pvVar18 + local_f8);
          pvVar20 = (void *)((long)pvVar20 + local_f8);
          pvVar24 = (void *)((long)pvVar24 + local_f8);
          pvVar26 = (void *)((long)pvVar26 + local_f8);
        } while (uVar16 != local_170);
      }
      local_1e0 = local_1e0 + 1;
      local_1e8 = (pointer)((long)local_1e8 + local_1f8);
      local_1a0 = (void *)((long)local_1a0 + local_110);
      local_1a8 = (void *)((long)local_1a8 + local_110);
      local_198 = (void *)((long)local_198 + local_110);
      local_190 = (void *)((long)local_190 + local_110);
    } while (local_1e0 != local_188);
    puVar13 = (undefined8 *)local_208[2].data;
    if (0 < (int)local_188) {
      fVar27 = (float)*puVar13;
      fVar28 = (float)((ulong)*puVar13 >> 0x20);
      lVar17 = 0;
      pfVar22 = local_200;
      do {
        if (0 < (int)local_1f0) {
          lVar23 = 0;
          do {
            auVar29._4_4_ = fVar27 + -1.0;
            auVar29._0_4_ = fVar28 + -1.0;
            auVar29._8_4_ = fVar28 + -1.0;
            auVar29._12_4_ = fVar27 + -1.0;
            auVar29 = minps(*(undefined1 (*) [16])((long)pfVar22 + lVar23),auVar29);
            auVar29 = maxps(auVar29,ZEXT816(0));
            *(undefined1 (*) [16])((long)pfVar22 + lVar23) = auVar29;
            lVar23 = lVar23 + 0x10;
          } while (local_1d8 << 4 != lVar23);
        }
        lVar17 = lVar17 + 1;
        pfVar22 = (pointer)((long)pfVar22 + local_1f8);
      } while (lVar17 != local_188);
    }
  }
  local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (Rect *)0x0;
  local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (Rect *)0x0;
  local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  if (0 < (int)local_188) {
    local_1b8 = (float)this->min_size * *(float *)(puVar13 + 1);
    local_1d8 = local_1d8 << 2;
    lVar23 = 0;
    lVar17 = local_188;
    do {
      pfVar22 = local_200 + lVar23 * local_108;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x4;
      local_150 = 1;
      local_148 = 0;
      local_140 = 0x400000002;
      local_138 = (int)local_1f0;
      local_134 = 1;
      local_130 = local_108;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = pfVar22;
      if (0 < local_138) {
        sVar5 = local_208->elemsize;
        sVar6 = local_208->cstep;
        pvVar18 = local_208->data;
        uVar19 = 0;
        do {
          lVar14 = (long)(int)uVar19;
          fVar27 = pfVar22[lVar14];
          if ((local_1b8 <= (pfVar22[lVar14 + 2] + 1.0) - fVar27) &&
             (local_1b8 <= (pfVar22[lVar14 + 3] + 1.0) - pfVar22[lVar14 + 1])) {
            local_268._4_4_ = pfVar22[lVar14 + 1];
            local_268._0_4_ = fVar27;
            uStack_260._0_4_ = pfVar22[lVar14 + 2];
            uStack_260._4_4_ = pfVar22[lVar14 + 3];
            if (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_248,
                         (iterator)
                         local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_268);
            }
            else {
              (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 = fVar27;
              (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = (float)local_268._4_4_;
              (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = (float)uStack_260;
              (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = uStack_260._4_4_;
              local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            pfVar15 = (float *)((long)pvVar18 + uVar19 + sVar5 * sVar6 * lVar17);
            if (local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_228,
                         (iterator)
                         local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,pfVar15);
            }
            else {
              *local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *pfVar15;
              local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar19 = uVar19 + 4;
        } while (local_1d8 != uVar19);
      }
      lVar23 = lVar23 + 1;
      lVar17 = lVar17 + 1;
    } while (lVar23 != local_188);
    if ((local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      qsort_descent_inplace<ncnn::Rect>
                (&local_248,&local_228,0,
                 (int)((ulong)((long)local_228.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_228.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar25 = this->pre_nms_topN;
  if ((0 < (long)iVar25) &&
     (iVar25 < (int)((ulong)((long)local_248.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_248.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_248,(long)iVar25);
    std::vector<float,_std::allocator<float>_>::resize(&local_228,(long)this->pre_nms_topN);
  }
  pRVar10 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pRVar9 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_268 = (undefined1  [8])0x0;
  uStack_260 = (unsigned_long *)0x0;
  local_258 = (unsigned_long *)0x0;
  local_1b8 = this->nms_thresh;
  uVar19 = (long)local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  std::vector<float,_std::allocator<float>_>::vector(&local_168,uVar19,(allocator_type *)&local_1d0)
  ;
  if (pRVar10 != pRVar9) {
    pfVar15 = &(local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    lVar17 = 0;
    do {
      uVar2 = ((Rect *)(pfVar15 + -2))->x1;
      uVar4 = ((Rect *)(pfVar15 + -2))->y1;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar17] =
           ((float)((ulong)*(undefined8 *)pfVar15 >> 0x20) - (float)uVar4) *
           ((float)*(undefined8 *)pfVar15 - (float)uVar2);
      lVar17 = lVar17 + 1;
      pfVar15 = pfVar15 + 4;
    } while (uVar19 + (uVar19 == 0) != lVar17);
    local_1d0 = 0;
    do {
      if ((long)uStack_260 - (long)local_268 == 0) {
LAB_0013d875:
        if (uStack_260 == local_258) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_268,uStack_260,
                     &local_1d0);
        }
        else {
          *uStack_260 = local_1d0;
          uStack_260 = uStack_260 + 1;
        }
      }
      else {
        lVar17 = (long)uStack_260 - (long)local_268 >> 3;
        fVar27 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start[local_1d0].x1;
        bVar8 = true;
        lVar23 = 0;
        do {
          lVar14 = *(long *)((long)local_268 + lVar23 * 8);
          fVar28 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14].x2;
          fVar32 = 0.0;
          if (fVar27 <= fVar28) {
            pRVar21 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar14;
            fVar30 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[local_1d0].x2;
            fVar31 = pRVar21->x1;
            if (fVar31 <= fVar30) {
              fVar33 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[local_1d0].y1;
              fVar34 = pRVar21->y2;
              if (fVar33 <= fVar34) {
                fVar1 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start[local_1d0].y2;
                fVar35 = pRVar21->y1;
                if (fVar35 <= fVar1) {
                  if (fVar30 <= fVar28) {
                    fVar28 = fVar30;
                  }
                  if (fVar31 <= fVar27) {
                    fVar31 = fVar27;
                  }
                  if (fVar1 <= fVar34) {
                    fVar34 = fVar1;
                  }
                  if (fVar35 <= fVar33) {
                    fVar35 = fVar33;
                  }
                  fVar32 = (fVar34 - fVar35) * (fVar28 - fVar31);
                }
              }
            }
          }
          if (local_1b8 <
              fVar32 / ((local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[local_1d0] - fVar32) +
                       local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14])) {
            bVar8 = false;
          }
          lVar23 = lVar23 + 1;
        } while (lVar17 + (ulong)(lVar17 == 0) != lVar23);
        if (bVar8) goto LAB_0013d875;
      }
      local_1d0 = local_1d0 + 1;
    } while (local_1d0 < uVar19);
  }
  if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar11 = local_120;
  uVar19 = (ulong)((long)uStack_260 - (long)local_268) >> 3;
  uVar16 = uVar19 & 0xffffffff;
  if (this->after_nms_topN < (int)uVar19) {
    uVar16 = (ulong)(uint)this->after_nms_topN;
  }
  this_00 = (local_120->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar12 = (int)uVar16;
  Mat::create(this_00,4,1,iVar12,4,(Allocator *)0x0);
  iVar25 = -100;
  if ((this_00->data != (void *)0x0) && (sVar5 = this_00->cstep, (long)this_00->c * sVar5 != 0)) {
    if (0 < iVar12) {
      sVar6 = this_00->elemsize;
      pfVar15 = (float *)((long)this_00->data + 0xc);
      uVar19 = 0;
      do {
        lVar17 = *(long *)((long)local_268 + uVar19 * 8);
        pfVar15[-3] = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17].x1;
        pfVar15[-2] = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17].y1;
        pfVar15[-1] = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17].x2;
        *pfVar15 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17].y2;
        uVar19 = uVar19 + 1;
        pfVar15 = (float *)((long)pfVar15 + sVar5 * sVar6);
      } while (uVar16 != uVar19);
    }
    pMVar7 = (pvVar11->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar25 = 0;
    if (0x40 < (ulong)((long)(pvVar11->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7)) {
      Mat::create(pMVar7 + 1,1,1,iVar12,4,(Allocator *)0x0);
      pfVar15 = (float *)pMVar7[1].data;
      iVar25 = -100;
      if (pfVar15 != (float *)0x0) {
        sVar5 = pMVar7[1].cstep;
        iVar25 = -100;
        if (((long)pMVar7[1].c * sVar5 != 0) && (iVar25 = 0, 0 < iVar12)) {
          sVar6 = pMVar7[1].elemsize;
          iVar25 = 0;
          uVar19 = 0;
          do {
            *pfVar15 = local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[*(long *)((long)local_268 + uVar19 * 8)];
            uVar19 = uVar19 + 1;
            pfVar15 = (float *)((long)pfVar15 + sVar5 * sVar6);
          } while (uVar16 != uVar19);
        }
      }
    }
  }
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268,(long)local_258 - (long)local_268);
  }
  if (local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (Rect *)0x0) {
    operator_delete(local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128 != (pointer)0x0) {
    LOCK();
    *local_128 = (float)((int)*local_128 + -1);
    UNLOCK();
    if (*local_128 == 0.0) {
      if (local_b8 == (long *)0x0) {
        if (local_d8 != (pointer)0x0) {
          free(local_d8);
        }
      }
      else {
        (**(code **)(*local_b8 + 0x18))();
      }
    }
  }
  return iVar25;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = static_cast<float>(anchor_w * exp(dw));
                float pb_h = static_cast<float>(anchor_h * exp(dh));

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<size_t> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}